

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  FileDescriptorProto *from_local;
  FileDescriptorProto *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_00410b00;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->dependency_);
  RepeatedField<int>::RepeatedField(&this->public_dependency_);
  RepeatedField<int>::RepeatedField(&this->weak_dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField(&this->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField(&this->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField(&this->extension_);
  SharedCtor(this);
  MergeFrom(this,from);
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(const FileDescriptorProto& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}